

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddTreeSiftingAux(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  Cudd_AggregationType CVar1;
  int iVar2;
  Cudd_ReorderingType method_00;
  
  method_00 = CUDD_REORDER_GROUP_SIFT;
  if (method == CUDD_REORDER_LAZY_SIFT) {
    method_00 = CUDD_REORDER_LAZY_SIFT;
  }
  do {
    if (treenode == (MtrNode *)0x0) {
      return 1;
    }
    if (treenode->child == (MtrNode *)0x0) {
      if ((1 < treenode->size) && (iVar2 = ddReorderChildren(table,treenode,method), iVar2 == 0)) {
        return 0;
      }
    }
    else {
      iVar2 = ddTreeSiftingAux(table,treenode->child,method);
      if (iVar2 == 0) {
        return 0;
      }
      CVar1 = table->groupcheck;
      table->groupcheck = CUDD_NO_CHECK;
      iVar2 = ddReorderChildren(table,treenode,method_00);
      table->groupcheck = CVar1;
      if (iVar2 == 0) {
        return 0;
      }
    }
    treenode = treenode->younger;
  } while( true );
}

Assistant:

static int
ddTreeSiftingAux(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    MtrNode  *auxnode;
    int res;
    Cudd_AggregationType saveCheck;

#ifdef DD_DEBUG
    Mtr_PrintGroups(treenode,1);
#endif

    auxnode = treenode;
    while (auxnode != NULL) {
        if (auxnode->child != NULL) {
            if (!ddTreeSiftingAux(table, auxnode->child, method))
                return(0);
            saveCheck = table->groupcheck;
            table->groupcheck = CUDD_NO_CHECK;
            if (method != CUDD_REORDER_LAZY_SIFT)
              res = ddReorderChildren(table, auxnode, CUDD_REORDER_GROUP_SIFT);
            else
              res = ddReorderChildren(table, auxnode, CUDD_REORDER_LAZY_SIFT);
            table->groupcheck = saveCheck;

            if (res == 0)
                return(0);
        } else if (auxnode->size > 1) {
            if (!ddReorderChildren(table, auxnode, method))
                return(0);
        }
        auxnode = auxnode->younger;
    }

    return(1);

}